

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

void lws_get_peer_addresses
               (lws *wsi,lws_sockfd_type fd,char *name,int name_len,char *rip,int rip_len)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  void *p;
  sockaddr_in sin4;
  socklen_t len;
  int rip_len_local;
  char *rip_local;
  int name_len_local;
  char *name_local;
  lws_sockfd_type fd_local;
  lws *wsi_local;
  
  *rip = '\0';
  *name = '\0';
  sin4.sin_zero[0] = '\x10';
  sin4.sin_zero[1] = '\0';
  sin4.sin_zero[2] = '\0';
  sin4.sin_zero[3] = '\0';
  sin4.sin_zero._4_4_ = rip_len;
  iVar1 = getpeername(fd,(sockaddr *)&p,(socklen_t *)sin4.sin_zero);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _lws_log(2,"getpeername: %s\n",pcVar3);
  }
  else {
    lws_get_addresses(wsi->vhost,(sockaddr *)&p,name,name_len,rip,sin4.sin_zero._4_4_);
  }
  return;
}

Assistant:

void
lws_get_peer_addresses(struct lws *wsi, lws_sockfd_type fd, char *name,
		       int name_len, char *rip, int rip_len)
{
#ifndef LWS_PLAT_OPTEE
	socklen_t len;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 sin6;
#endif
	struct sockaddr_in sin4;
	void *p;

	rip[0] = '\0';
	name[0] = '\0';

#ifdef LWS_WITH_IPV6
	if (LWS_IPV6_ENABLED(wsi->vhost)) {
		len = sizeof(sin6);
		p = &sin6;
	} else
#endif
	{
		len = sizeof(sin4);
		p = &sin4;
	}

	if (getpeername(fd, p, &len) < 0) {
		lwsl_warn("getpeername: %s\n", strerror(LWS_ERRNO));
		goto bail;
	}

	lws_get_addresses(wsi->vhost, p, name, name_len, rip, rip_len);

bail:
#endif
	(void)wsi;
	(void)fd;
	(void)name;
	(void)name_len;
	(void)rip;
	(void)rip_len;
}